

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O1

void ggml_opt_fit(ggml_backend_sched_t backend_sched,ggml_context *ctx_compute,ggml_tensor *inputs,
                 ggml_tensor *outputs,ggml_opt_dataset_t dataset,ggml_opt_loss_type loss_type,
                 ggml_opt_get_optimizer_params get_opt_pars,int64_t nepoch,int64_t nbatch_logical,
                 float val_split,bool silent)

{
  long lVar1;
  pointer pfVar2;
  pointer piVar3;
  bool bVar4;
  ggml_opt_params params;
  long lVar5;
  ggml_opt_context_t opt_ctx;
  ggml_opt_result_t result_train;
  ggml_opt_result_t result_eval;
  char *pcVar6;
  int line;
  long lVar7;
  code *callback_train;
  int64_t epoch;
  long local_a0;
  undefined4 in_stack_ffffffffffffffbc;
  
  ggml_time_init();
  ggml_time_us();
  lVar7 = dataset->data->ne[1];
  lVar5 = lVar7 / nbatch_logical;
  if (lVar7 % nbatch_logical == 0) {
    lVar1 = inputs->ne[1];
    if (nbatch_logical % lVar1 == 0) {
      if (val_split < 0.0) {
        pcVar6 = "val_split >= 0.0f";
        line = 0x322;
      }
      else {
        if (val_split < 1.0) {
          local_a0 = 1;
          params.ctx_compute = (ggml_context *)outputs;
          params.backend_sched = (ggml_backend_sched_t)lVar5;
          params.inputs = (ggml_tensor *)backend_sched;
          params.outputs = (ggml_tensor *)ctx_compute;
          params._32_8_ = inputs;
          params._40_8_ = outputs;
          params.get_opt_pars._0_4_ = loss_type;
          params.get_opt_pars._4_4_ = 2;
          params.get_opt_pars_ud._0_4_ = (int)(nbatch_logical / lVar1);
          params.get_opt_pars_ud._4_4_ = in_stack_ffffffffffffffbc;
          opt_ctx = ggml_opt_init(params);
          if (nbatch_logical < lVar7) {
            ggml_opt_dataset_shuffle(opt_ctx,dataset,-1);
          }
          result_train = (ggml_opt_result_t)operator_new(0x50);
          result_train->ndata = 0;
          (result_train->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (result_train->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (result_train->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (result_train->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (result_train->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (result_train->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          result_train->ncorrect = 0;
          result_train->opt_period = -1;
          callback_train = (ggml_opt_epoch_callback)0x0;
          result_train->loss_per_datapoint = false;
          result_eval = (ggml_opt_result_t)operator_new(0x50);
          result_eval->ndata = 0;
          (result_eval->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (result_eval->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (result_eval->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (result_eval->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (result_eval->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (result_eval->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          result_eval->ncorrect = 0;
          result_eval->opt_period = -1;
          result_eval->loss_per_datapoint = false;
          if (!silent) {
            callback_train = ggml_opt_epoch_callback_progress_bar;
          }
          if (0 < nepoch) {
            lVar7 = (nbatch_logical / lVar1) * lVar1 * (long)((float)lVar5 * (1.0 - val_split));
            do {
              if (lVar7 - nbatch_logical != 0 && nbatch_logical <= lVar7) {
                ggml_opt_dataset_shuffle(opt_ctx,dataset,lVar7);
              }
              result_train->ndata = 0;
              pfVar2 = (result_train->loss).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if ((result_train->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish != pfVar2) {
                (result_train->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish = pfVar2;
              }
              piVar3 = (result_train->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((result_train->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != piVar3) {
                (result_train->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = piVar3;
              }
              result_train->ncorrect = 0;
              result_eval->ndata = 0;
              pfVar2 = (result_eval->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl
                       .super__Vector_impl_data._M_start;
              if ((result_eval->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish != pfVar2) {
                (result_eval->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish = pfVar2;
              }
              piVar3 = (result_eval->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((result_eval->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != piVar3) {
                (result_eval->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = piVar3;
              }
              result_eval->ncorrect = 0;
              if (silent) {
                ggml_opt_epoch(opt_ctx,dataset,result_train,result_eval,lVar7,callback_train,
                               callback_train);
              }
              else {
                fprintf(_stderr,"%s: epoch %04ld/%04ld:\n","ggml_opt_fit",local_a0,nepoch);
                ggml_opt_epoch(opt_ctx,dataset,result_train,result_eval,lVar7,callback_train,
                               callback_train);
                fputc(10,_stderr);
              }
              bVar4 = local_a0 < nepoch;
              local_a0 = local_a0 + 1;
            } while (bVar4);
          }
          if (!silent) {
            ggml_opt_fit_cold_1();
          }
          ggml_opt_free(opt_ctx);
          ggml_opt_result_free(result_train);
          ggml_opt_result_free(result_eval);
          return;
        }
        pcVar6 = "val_split < 1.0f";
        line = 0x323;
      }
    }
    else {
      pcVar6 = "nbatch_logical % nbatch_physical == 0";
      line = 0x31d;
    }
  }
  else {
    pcVar6 = "ndata % nbatch_logical == 0";
    line = 0x31c;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-opt.cpp",
             line,"GGML_ASSERT(%s) failed",pcVar6);
}

Assistant:

void ggml_opt_fit(
        ggml_backend_sched_t            backend_sched,
        ggml_context                  * ctx_compute,
        ggml_tensor                   * inputs,
        ggml_tensor                   * outputs,
        ggml_opt_dataset_t              dataset,
        enum ggml_opt_loss_type         loss_type,
        ggml_opt_get_optimizer_params   get_opt_pars,
        int64_t                         nepoch,
        int64_t                         nbatch_logical,
        float                           val_split,
        bool                            silent) {
    ggml_time_init();
    const int64_t t_start_us = ggml_time_us();

    const int64_t ndata           = ggml_opt_dataset_data(dataset)->ne[1];
    const int64_t nbatch_physical = inputs->ne[1];
    GGML_ASSERT(ndata          % nbatch_logical  == 0);
    GGML_ASSERT(nbatch_logical % nbatch_physical == 0);

    const int64_t opt_period       = nbatch_logical / nbatch_physical;
    const int64_t nbatches_logical = ndata / nbatch_logical;

    GGML_ASSERT(val_split >= 0.0f);
    GGML_ASSERT(val_split <  1.0f);
    const int64_t ibatch_split = int64_t(((1.0f - val_split) * nbatches_logical)) * opt_period; // train <-> val split index (physical)
    const int64_t idata_split  = ibatch_split * nbatch_physical;

    int64_t epoch = 1;

    ggml_opt_params params = ggml_opt_default_params(backend_sched, ctx_compute, inputs, outputs, loss_type);
    params.opt_period      = opt_period;
    params.get_opt_pars    = get_opt_pars;
    params.get_opt_pars_ud = &epoch;
    ggml_opt_context_t opt_ctx = ggml_opt_init(params);

    // Shuffling the data is generally useful but there is only a point if not all data is used in a single batch.
    if (nbatch_logical < ndata) {
        ggml_opt_dataset_shuffle(opt_ctx, dataset, -1); // Shuffle all data (train + validation).
    }

    ggml_opt_result_t result_train = ggml_opt_result_init();
    ggml_opt_result_t result_val   = ggml_opt_result_init();

    ggml_opt_epoch_callback epoch_callback = silent ? nullptr : ggml_opt_epoch_callback_progress_bar;

    for (; epoch <= nepoch; ++epoch) {
        if (nbatch_logical < idata_split) {
            ggml_opt_dataset_shuffle(opt_ctx, dataset, idata_split);
        }

        ggml_opt_result_reset(result_train);
        ggml_opt_result_reset(result_val);

        if (!silent) {
            fprintf(stderr, "%s: epoch %04" PRId64 "/%04" PRId64 ":\n", __func__, epoch, nepoch);
        }
        ggml_opt_epoch(opt_ctx, dataset, result_train, result_val, idata_split, epoch_callback, epoch_callback);
        if (!silent) {
            fprintf(stderr, "\n");
        }
    }

    if (!silent) {
        int64_t t_total_s = (ggml_time_us() - t_start_us) / 1000000;
        const int64_t t_total_h = t_total_s / 3600;
        t_total_s -= t_total_h * 3600;
        const int64_t t_total_m = t_total_s / 60;
        t_total_s -= t_total_m * 60;
        fprintf(stderr, "%s: training took %02" PRId64 ":%02" PRId64 ":%02" PRId64 "\n", __func__, t_total_h, t_total_m, t_total_s);
    }

    ggml_opt_free(opt_ctx);
    ggml_opt_result_free(result_train);
    ggml_opt_result_free(result_val);
}